

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.cpp
# Opt level: O1

float vector_utils::sum(vector<float,_std::allocator<float>_> *a)

{
  pointer pfVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  
  pfVar1 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar2 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 2;
    fVar4 = 0.0;
    lVar3 = 0;
    do {
      fVar4 = fVar4 + pfVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    return fVar4;
  }
  return 0.0;
}

Assistant:

float vector_utils::sum(const std::vector<float>& a)
{
  float accumulator = 0.0f;

  for (auto i = 0; i < a.size(); ++i)
  {
    accumulator += a[i];
  }

  return accumulator;
}